

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallFileGenerator::GenerateImportTargetsConfig
          (cmExportInstallFileGenerator *this,ostream *os,string *config,string *suffix)

{
  cmExportSet *pcVar1;
  cmTargetExport *pcVar2;
  _Alloc_hider _Var3;
  cmGeneratorTarget *headTarget;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  cmLocalGenerator *lg;
  cmGeneratorTarget *pcVar7;
  pointer puVar8;
  basic_string_view<char,_std::char_traits<char>_> __str;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string importedXcFrameworkLocation;
  string local_110;
  ostream *local_f0;
  string local_e8;
  pointer local_c8;
  undefined8 local_c0;
  string local_b8;
  pointer local_98;
  ImportPropertyMap properties;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  importedLocations;
  
  pcVar1 = this->IEGen->ExportSet;
  puVar8 = (pcVar1->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98 = (pcVar1->TargetExports).
             super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_f0 = os;
  if (puVar8 != local_98) {
    do {
      pcVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
               super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
               super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
      pcVar7 = pcVar2->Target;
      TVar5 = cmGeneratorTarget::GetType(pcVar7);
      if (TVar5 == OBJECT_LIBRARY) {
        TVar5 = (uint)(pcVar2->ObjectsGenerator == (cmInstallTargetGenerator *)0x0) * 3 +
                OBJECT_LIBRARY;
      }
      if (TVar5 != INTERFACE_LIBRARY) {
        properties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &properties._M_t._M_impl.super__Rb_tree_header._M_header;
        properties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &importedLocations._M_t._M_impl.super__Rb_tree_header._M_header;
        importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar7,config,suffix,
                   ((puVar8->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->ArchiveGenerator,
                   &properties,&importedLocations);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar7,config,suffix,
                   ((puVar8->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->LibraryGenerator,
                   &properties,&importedLocations);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar7,config,suffix,
                   ((puVar8->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->RuntimeGenerator,
                   &properties,&importedLocations);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar7,config,suffix,
                   ((puVar8->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->ObjectsGenerator,
                   &properties,&importedLocations);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar7,config,suffix,
                   ((puVar8->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->FrameworkGenerator
                   ,&properties,&importedLocations);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar7,config,suffix,
                   ((puVar8->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->BundleGenerator,
                   &properties,&importedLocations);
        if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          pcVar7 = ((puVar8->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target;
          cmExportFileGenerator::SetImportDetailProperties
                    (&this->super_cmExportFileGenerator,config,suffix,pcVar7,&properties);
          cmExportFileGenerator::SetImportLinkInterface
                    (&this->super_cmExportFileGenerator,config,suffix,InstallInterface,pcVar7,
                     &properties);
          pcVar2 = (puVar8->_M_t).
                   super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                   super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                   super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
          importedXcFrameworkLocation._M_dataplus._M_p =
               (pointer)&importedXcFrameworkLocation.field_2;
          _Var3._M_p = (pcVar2->XcFrameworkLocation)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&importedXcFrameworkLocation,_Var3._M_p,
                     _Var3._M_p + (pcVar2->XcFrameworkLocation)._M_string_length);
          if (importedXcFrameworkLocation._M_string_length != 0) {
            cmGeneratorExpression::Preprocess
                      (&local_e8,&importedXcFrameworkLocation,InstallInterface,true);
            std::__cxx11::string::operator=
                      ((string *)&importedXcFrameworkLocation,(string *)&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,importedXcFrameworkLocation._M_dataplus._M_p,
                       importedXcFrameworkLocation._M_dataplus._M_p +
                       importedXcFrameworkLocation._M_string_length);
            lg = cmGeneratorTarget::GetLocalGenerator
                           (((puVar8->_M_t).
                             super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                             .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
            headTarget = ((puVar8->_M_t).
                          super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                          .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target;
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            local_110._M_string_length = 0;
            local_110.field_2._M_local_buf[0] = '\0';
            cmGeneratorExpression::Evaluate
                      (&local_e8,&local_b8,lg,config,headTarget,
                       (cmGeneratorExpressionDAGChecker *)0x0,headTarget,&local_110);
            std::__cxx11::string::operator=
                      ((string *)&importedXcFrameworkLocation,(string *)&local_e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                       local_110.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((importedXcFrameworkLocation._M_string_length != 0) &&
               (bVar4 = cmsys::SystemTools::FileIsFullPath(&importedXcFrameworkLocation), !bVar4)) {
              local_e8._M_dataplus._M_p = (pointer)importedXcFrameworkLocation._M_string_length;
              local_e8._M_string_length = (size_type)importedXcFrameworkLocation._M_dataplus._M_p;
              __str._M_str = "${_IMPORT_PREFIX}/";
              __str._M_len = 0x12;
              iVar6 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_e8,0,
                                 0x12,__str);
              if (iVar6 != 0) {
                local_e8._M_dataplus._M_p = (pointer)0x12;
                local_e8._M_string_length = 0x82434b;
                local_e8.field_2._M_allocated_capacity = 0;
                local_e8.field_2._8_8_ = importedXcFrameworkLocation._M_string_length;
                local_c8 = importedXcFrameworkLocation._M_dataplus._M_p;
                local_c0 = 0;
                views._M_len = 2;
                views._M_array = (iterator)&local_e8;
                cmCatViews(&local_110,views);
                std::__cxx11::string::operator=
                          ((string *)&importedXcFrameworkLocation,(string *)&local_110);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p,
                                  CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                           local_110.field_2._M_local_buf[0]) + 1);
                }
              }
            }
          }
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                    (this,local_f0,config,suffix,pcVar7,&properties,&importedXcFrameworkLocation);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[8])
                    (this,local_f0,pcVar7,&properties,&importedLocations,
                     &importedXcFrameworkLocation);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)importedXcFrameworkLocation._M_dataplus._M_p !=
              &importedXcFrameworkLocation.field_2) {
            operator_delete(importedXcFrameworkLocation._M_dataplus._M_p,
                            importedXcFrameworkLocation.field_2._M_allocated_capacity + 1);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&importedLocations._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&properties._M_t);
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != local_98);
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix)
{
  // Add each target in the set to the export.
  for (std::unique_ptr<cmTargetExport> const& te :
       this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (this->GetExportTargetType(te.get()) ==
        cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    ImportPropertyMap properties;
    std::set<std::string> importedLocations;

    this->SetImportLocationProperty(config, suffix, te->ArchiveGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->LibraryGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->RuntimeGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->ObjectsGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->FrameworkGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->BundleGenerator,
                                    properties, importedLocations);

    // If any file location was set for the target add it to the
    // import file.
    if (!properties.empty()) {
      // Get the rest of the target details.
      cmGeneratorTarget* gtgt = te->Target;
      this->SetImportDetailProperties(config, suffix, gtgt, properties);

      this->SetImportLinkInterface(config, suffix,
                                   cmGeneratorExpression::InstallInterface,
                                   gtgt, properties);

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      std::string importedXcFrameworkLocation = te->XcFrameworkLocation;
      if (!importedXcFrameworkLocation.empty()) {
        importedXcFrameworkLocation = cmGeneratorExpression::Preprocess(
          importedXcFrameworkLocation,
          cmGeneratorExpression::PreprocessContext::InstallInterface, true);
        importedXcFrameworkLocation = cmGeneratorExpression::Evaluate(
          importedXcFrameworkLocation, te->Target->GetLocalGenerator(), config,
          te->Target, nullptr, te->Target);
        if (!importedXcFrameworkLocation.empty() &&
            !cmSystemTools::FileIsFullPath(importedXcFrameworkLocation) &&
            !cmHasLiteralPrefix(importedXcFrameworkLocation,
                                "${_IMPORT_PREFIX}/")) {
          importedXcFrameworkLocation =
            cmStrCat("${_IMPORT_PREFIX}/", importedXcFrameworkLocation);
        }
      }
      this->GenerateImportPropertyCode(os, config, suffix, gtgt, properties,
                                       importedXcFrameworkLocation);
      this->GenerateImportedFileChecksCode(
        os, gtgt, properties, importedLocations, importedXcFrameworkLocation);
    }
  }
}